

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O1

void __thiscall GF2::WW<126UL>::Set(WW<126UL> *this,size_t pos1,size_t pos2,bool val)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  byte bVar3;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  sbyte sVar4;
  
  uVar6 = pos1 >> 6;
  uVar7 = pos2 >> 6;
  if (uVar6 == uVar7) {
    if (pos1 < pos2) {
      do {
        uVar6 = 1L << ((byte)pos1 & 0x3f);
        if (val) {
          this->_words[pos1 >> 6] = this->_words[pos1 >> 6] | uVar6;
        }
        else {
          this->_words[pos1 >> 6] = this->_words[pos1 >> 6] & ~uVar6;
        }
        pos1 = pos1 + 1;
      } while (pos2 != pos1);
    }
    return;
  }
  if ((pos1 & 0x3f) != 0) {
    sVar4 = (sbyte)(pos1 & 0x3f);
    bVar3 = -sVar4;
    uVar5 = -1L << sVar4 | this->_words[uVar6];
    if (!val) {
      uVar5 = (this->_words[uVar6] << (bVar3 & 0x3f)) >> (bVar3 & 0x3f);
    }
    this->_words[uVar6] = uVar5;
    uVar6 = uVar6 + 1;
  }
  if ((pos2 & 0x3f) != 0) {
    uVar5 = this->_words[uVar7];
    sVar4 = (sbyte)(pos2 & 0x3f);
    this->_words[uVar7] = (uVar5 >> sVar4) << sVar4;
    if (val) {
      this->_words[uVar7] = uVar5 | 0xffffffffffffffffU >> (-sVar4 & 0x3fU);
    }
  }
  auVar2 = _DAT_0013f020;
  auVar1 = _DAT_0013f010;
  lVar8 = uVar7 - uVar6;
  if (uVar6 <= uVar7 && lVar8 != 0) {
    lVar9 = lVar8 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar7 = 0;
    auVar10 = auVar10 ^ _DAT_0013f020;
    do {
      auVar11._8_4_ = (int)uVar7;
      auVar11._0_8_ = uVar7;
      auVar11._12_4_ = (int)(uVar7 >> 0x20);
      auVar11 = (auVar11 | auVar1) ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar11._0_4_ ||
                  auVar10._4_4_ < auVar11._4_4_) & 1)) {
        this->_words[uVar6 + uVar7] = -(ulong)val;
      }
      if ((auVar11._12_4_ != auVar10._12_4_ || auVar11._8_4_ <= auVar10._8_4_) &&
          auVar11._12_4_ <= auVar10._12_4_) {
        this->_words[uVar6 + uVar7 + 1] = -(ulong)val;
      }
      uVar7 = uVar7 + 2;
    } while ((lVar8 + 1U & 0xfffffffffffffffe) != uVar7);
  }
  return;
}

Assistant:

void Set(size_t pos1, size_t pos2, bool val)
	{	
		// номера слов представлений
		size_t wpos1 = pos1 / B_PER_W, wpos2 = pos2 / B_PER_W, pos;
		// в одном слове?
		if (wpos1 == wpos2)
		{
			for (pos = pos1; pos < pos2; Set(pos++, val));
			return;
		}
		// начинаем посередине слова представления?
		if (pos = pos1 % B_PER_W)
		{
			(_words[wpos1] <<= (B_PER_W - pos)) >>= B_PER_W - pos;
			if (val) 
				_words[wpos1] |= WORD_MAX << pos;
			wpos1++;
		}
		// заканчиваем посередине слова представления?
		if (pos = pos2 % B_PER_W)
		{
			(_words[wpos2] >>= pos) <<= pos;
			if (val) 
				_words[wpos2] |= WORD_MAX >> (B_PER_W - pos);
		}
		// заполняем полные слова
		for (pos = wpos1; pos < wpos2; _words[pos++] = (val ? WORD_MAX : 0));
	}